

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 扑克牌比大小.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  int label2;
  istream *piVar3;
  ostream *poVar4;
  string poker2;
  string poker1;
  string str;
  char *local_110;
  long local_108;
  char local_100 [16];
  char *local_f0;
  long local_e8;
  char local_e0 [16];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_d0,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::find((char)(string *)&local_d0,0x2d);
    std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_d0);
    std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_d0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_f0,local_f0 + local_e8);
    iVar2 = check_style(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_110,local_110 + local_108);
    label2 = check_style(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_f0,local_f0 + local_e8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_110,local_110 + local_108);
    iVar2 = poker_compare(&local_b0,iVar2,&local_50,label2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (iVar2 == 1) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_f0,local_e8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else if (iVar2 == 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_110,local_108);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      poVar4 = (ostream *)&std::cout;
    }
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return 0;
}

Assistant:

int main()
{
    string str;
    while (getline(cin,str))
    {
        int pos=str.find('-');
        string poker1=str.substr(0,pos);
        string poker2=str.substr(pos+1,str.size()-pos+1);
        int label1,label2;
        label1 = check_style(poker1);
        label2 = check_style(poker2);
        int compare = poker_compare(poker1,label1,poker2,label2);
        if (compare==0)
            cout<<poker2<<endl;
        else if (compare==1)
            cout<<poker1<<endl;
        else
            cout<<"ERROR"<<endl;
    }
    return 0;
}